

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

void nifti_swap_2bytes(size_t n,void *ar)

{
  ushort *puVar1;
  size_t ii;
  uchar *cp1;
  
  for (ii = 0; n != ii; ii = ii + 1) {
    puVar1 = (ushort *)((long)ar + ii * 2);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  }
  return;
}

Assistant:

void nifti_swap_2bytes( size_t n , void *ar )    /* 2 bytes at a time */
{
   register size_t ii ;
   unsigned char * cp1 = (unsigned char *)ar, * cp2 ;
   unsigned char   tval;

   for( ii=0 ; ii < n ; ii++ ){
       cp2 = cp1 + 1;
       tval = *cp1;  *cp1 = *cp2;  *cp2 = tval;
       cp1 += 2;
   }
   return ;
}